

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSimSat.c
# Opt level: O2

void Dch_ManResimulateCex2(Dch_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  Aig_Obj_t **ppAVar1;
  Vec_Ptr_t *vRoots;
  abctime aVar2;
  Aig_Obj_t *pAVar3;
  abctime aVar4;
  int iVar5;
  
  aVar2 = Abc_Clock();
  ppAVar1 = p->pAigTotal->pReprs;
  if (ppAVar1 == (Aig_Obj_t **)0x0) {
    pAVar3 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar3 = ppAVar1[pObj->Id];
  }
  if (pAVar3 == p->pAigTotal->pConst1) {
    Dch_ClassesCollectConst1Group(p->ppClasses,pObj,500,p->vSimRoots);
  }
  else {
    Dch_ClassesCollectOneClass(p->ppClasses,pRepr,p->vSimRoots);
  }
  p->nConeThis = 0;
  Aig_ManIncrementTravId(p->pAigTotal);
  p->pAigTotal->pConst1->TravId = p->pAigTotal->nTravIds;
  Dch_ManResimulateSolved_rec(p,pObj);
  Dch_ManResimulateSolved_rec(p,pRepr);
  iVar5 = p->nConeThis;
  if (p->nConeThis < p->nConeMax) {
    iVar5 = p->nConeMax;
  }
  p->nConeMax = iVar5;
  for (iVar5 = 0; vRoots = p->vSimRoots, iVar5 < vRoots->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vRoots,iVar5);
    Dch_ManResimulateOther_rec(p,pAVar3);
  }
  ppAVar1 = p->pAigTotal->pReprs;
  if (ppAVar1 == (Aig_Obj_t **)0x0) {
    pAVar3 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar3 = ppAVar1[pObj->Id];
  }
  if (pAVar3 == p->pAigTotal->pConst1) {
    iVar5 = Dch_ClassesRefineConst1Group(p->ppClasses,vRoots,0);
  }
  else {
    iVar5 = Dch_ClassesRefineOneClass(p->ppClasses,pRepr,0);
  }
  if (iVar5 != 0) {
    aVar4 = Abc_Clock();
    p->timeSimSat = p->timeSimSat + (aVar4 - aVar2);
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchSimSat.c"
                ,0xfa,"void Dch_ManResimulateCex2(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Dch_ManResimulateCex2( Dch_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pRoot;
    int i, RetValue;
    abctime clk = Abc_Clock();
    // get the equivalence class
    if ( Dch_ObjIsConst1Cand(p->pAigTotal, pObj) )
        Dch_ClassesCollectConst1Group( p->ppClasses, pObj, 500, p->vSimRoots );
    else
        Dch_ClassesCollectOneClass( p->ppClasses, pRepr, p->vSimRoots );
    // resimulate the cone of influence of the solved nodes
    p->nConeThis = 0;
    Aig_ManIncrementTravId( p->pAigTotal );
    Aig_ObjSetTravIdCurrent( p->pAigTotal, Aig_ManConst1(p->pAigTotal) );
    Dch_ManResimulateSolved_rec( p, pObj );
    Dch_ManResimulateSolved_rec( p, pRepr );
    p->nConeMax = Abc_MaxInt( p->nConeMax, p->nConeThis );
    // resimulate the cone of influence of the other nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimRoots, pRoot, i )
        Dch_ManResimulateOther_rec( p, pRoot );
    // refine this class
    if ( Dch_ObjIsConst1Cand(p->pAigTotal, pObj) )
        RetValue = Dch_ClassesRefineConst1Group( p->ppClasses, p->vSimRoots, 0 );
    else
        RetValue = Dch_ClassesRefineOneClass( p->ppClasses, pRepr, 0 );
    assert( RetValue );
p->timeSimSat += Abc_Clock() - clk;
}